

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O2

void __thiscall
coinscachepair_tests::linked_list_iterate_erase::test_method(linked_list_iterate_erase *this)

{
  long lVar1;
  iterator __position;
  CoinsCachePair *sentinel_00;
  iterator in_R8;
  iterator pvVar2;
  CoinsCachePair **in_R9;
  CoinsCachePair **ppCVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  CoinsCachePair *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  CoinsCachePair *local_120;
  char *local_118;
  char *local_110;
  undefined **local_108;
  undefined1 local_100;
  undefined1 *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  CoinsCachePair *node;
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  nodes;
  CoinsCachePair sentinel;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>
            (&sentinel);
  sentinel.second.m_flags = '\x01';
  sentinel.second.m_prev = &sentinel;
  sentinel.second.m_next = &sentinel;
  CreatePairs_abi_cxx11_(&nodes,(coinscachepair_tests *)&sentinel,sentinel_00);
  node = sentinel.second.m_next;
  for (__position._M_node =
            nodes.
            super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
      __position._M_node != (_List_node_base *)&nodes;
      __position = std::__cxx11::
                   list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                   ::erase(&nodes,__position._M_node)) {
    local_d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_d0 = "";
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x51;
    file.m_begin = (iterator)&local_d8;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e8,msg);
    local_100 = 0;
    local_108 = &PTR__lazy_ostream_011480b0;
    local_f8 = boost::unit_test::lazy_ostream::inst;
    local_f0 = "";
    local_118 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
    ;
    local_110 = "";
    local_120 = (CoinsCachePair *)(__position._M_node + 1);
    in_R8 = (iterator)0x2;
    in_R9 = &local_120;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
              (&local_108,&local_118,0x51,1,2,in_R9,"&(*expected)",&node,"node");
    node = (node->second).m_next;
  }
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x54;
  file_00.m_begin = (iterator)&local_130;
  msg_00.m_end = (iterator)in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
             msg_00);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_011480b0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_148 = "";
  pvVar2 = (iterator)0x2;
  ppCVar3 = &node;
  local_120 = &sentinel;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_108,&local_150,0x54,1,2,ppCVar3,"node",&local_120,"&sentinel");
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x57;
  file_01.m_begin = (iterator)&local_160;
  msg_01.m_end = (iterator)ppCVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_170,
             msg_01);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_011480b0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_178 = "";
  ppCVar3 = &local_120;
  local_120 = sentinel.second.m_next;
  pvVar2 = (iterator)0x2;
  local_188 = &sentinel;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_108,&local_180,0x57,1,2,ppCVar3,"sentinel.second.Next()",&local_188,"&sentinel")
  ;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = &DAT_00000058;
  file_02.m_begin = (iterator)&local_198;
  msg_02.m_end = (iterator)ppCVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a8,
             msg_02);
  local_100 = 0;
  local_108 = &PTR__lazy_ostream_011480b0;
  local_f8 = boost::unit_test::lazy_ostream::inst;
  local_f0 = "";
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1b0 = "";
  local_120 = sentinel.second.m_prev;
  local_188 = &sentinel;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_108,&local_1b8,0x58,1,2,&local_120,"sentinel.second.Prev()",&local_188,
             "&sentinel");
  std::__cxx11::
  _List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::_M_clear(&nodes.
              super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
            );
  CCoinsCacheEntry::~CCoinsCacheEntry(&sentinel.second);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(linked_list_iterate_erase)
{
    CoinsCachePair sentinel;
    sentinel.second.SelfRef(sentinel);
    auto nodes{CreatePairs(sentinel)};

    // Check iterating through pairs is identical to iterating through a list
    // Erase the nodes as we iterate through, but don't clear flags
    // The flags will be cleared by the CCoinsCacheEntry's destructor
    auto node{sentinel.second.Next()};
    for (auto expected{nodes.begin()}; expected != nodes.end(); expected = nodes.erase(expected)) {
        BOOST_CHECK_EQUAL(&(*expected), node);
        node = node->second.Next();
    }
    BOOST_CHECK_EQUAL(node, &sentinel);

    // Check that sentinel's next and prev are itself
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &sentinel);
}